

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O3

int ecx_readODlist(ecx_contextt *context,uint16 Slave,ec_ODlistt *pODlist)

{
  ushort uVar1;
  uint8 uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  undefined6 in_register_00000032;
  ushort uVar6;
  uint uVar7;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  int local_874;
  ec_errort local_854;
  ushort local_838 [2];
  byte local_833;
  byte local_830;
  short local_82e;
  uint8 local_82c [1012];
  uint8 local_438 [5];
  byte local_433;
  uint8 local_432 [1026];
  
  pODlist->Slave = Slave;
  pODlist->Entries = 0;
  ec_clearmbx((ec_mbxbuft *)local_838);
  ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,0);
  ec_clearmbx((ec_mbxbuft *)local_438);
  local_438[0] = '\b';
  local_438[1] = '\0';
  local_438[2] = '\0';
  local_438[3] = '\0';
  local_438[4] = '\0';
  uVar3 = CONCAT62(in_register_00000032,Slave) & 0xffffffff;
  uVar2 = ec_nextmbxcnt(context->slavelist[uVar3].mbx_cnt);
  context->slavelist[uVar3].mbx_cnt = uVar2;
  local_433 = uVar2 << 4 | 3;
  local_432[0] = '\0';
  local_432[1] = 0x80;
  local_432[2] = '\x01';
  local_432[3] = '\0';
  local_432[4] = '\0';
  local_432[5] = '\0';
  local_432[6] = '\x01';
  local_432[7] = '\0';
  local_874 = ecx_mbxsend(context,Slave,(ec_mbxbuft *)local_438,20000);
  if (0 < local_874) {
    iVar4 = -8;
    lVar5 = 2;
    uVar6 = 0;
    uVar3 = 0;
    while( true ) {
      ec_clearmbx((ec_mbxbuft *)local_838);
      local_874 = ecx_mbxreceive(context,Slave,(ec_mbxbuft *)local_838,700000);
      if (local_874 < 1) break;
      if (((local_833 & 0xf) != 3) || ((local_830 & 0x7f) != 2)) {
        if ((local_830 & 0x7f) == 7) {
          local_854.Index = 0;
          local_854.SubIdx = '\0';
          *context->ecaterror = '\x01';
          local_854.field_6.AbortCode._0_1_ = local_82c[0];
          local_854.field_6.AbortCode._1_1_ = local_82c[1];
          local_854.field_6.field_1.ErrorReg = local_82c[2];
          local_854.field_6.field_1.b1 = local_82c[3];
          local_854.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
          local_854.Slave = Slave;
          ecx_pusherror(context,&local_854);
          return 0;
        }
        ecx_packeterror(context,Slave,0,'\0',1);
        return 0;
      }
      uVar7 = (int)(iVar4 + (uint)local_838[0]) / 2;
      if (0x400 < (uVar7 & 0xffff) + (int)(uVar3 & 0xffff)) {
        uVar7 = 0x401 - (int)uVar3;
        local_854.Index = 0;
        local_854.SubIdx = '\0';
        *context->ecaterror = '\x01';
        local_854._16_8_ = 0xf00000000000004;
        local_854.Slave = Slave;
        ecx_pusherror(context,&local_854);
      }
      uVar1 = pODlist->Entries;
      if (0x400 < (uVar7 & 0xffff) + (uint)uVar1) {
        uVar7 = 0x400 - uVar1;
      }
      pODlist->Entries = uVar1 + (short)uVar7;
      if ((short)uVar7 != 0) {
        memcpy(pODlist->Index + (uVar3 & 0xffff),local_82c + lVar5,(ulong)((uVar7 & 0xffff) * 2));
      }
      if (0x7f < uVar6) {
        return local_874;
      }
      uVar3 = (ulong)((int)uVar3 + uVar7);
      uVar6 = uVar6 + 1;
      iVar4 = -6;
      lVar5 = 0;
      if (local_82e == 0) {
        return local_874;
      }
    }
  }
  return local_874;
}

Assistant:

int ecx_readODlist(ecx_contextt *context, uint16 Slave, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   ec_mbxbuft MbxIn, MbxOut;
   int wkc;
   uint16 x, n, i, sp, offset;
   boolean stop;
   uint8 cnt;
   boolean First;

   pODlist->Slave = Slave;
   pODlist->Entries = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_ODLIST_REQ; /* get object description list request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(0x01); /* all objects */
   /* send get object description list request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      x = 0; 
      sp = 0;
      First = TRUE;
      offset = 1; /* offset to skip info header in first frame, otherwise set to 0 */
      do
      {
         stop = TRUE; /* assume this is last iteration */
         ec_clearmbx(&MbxIn);
         /* read slave response */
         wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
         /* got response ? */
         if (wkc > 0)
         {
            /* response should be CoE and "get object description list response" */
            if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
                ((aSDOp->Opcode & 0x7f) == ECT_GET_ODLIST_RES))
            {
               if (First)
               {   
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - (6 + 2)) / 2;
               }
               else
               {
                  /* extract number of indexes from mailbox data size */
                  n = (etohs(aSDOp->MbxHeader.length) - 6) / 2;
               }
               /* check if indexes fit in buffer structure */
               if ((sp + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST + 1 - sp;
                  ecx_SDOinfoerror(context, Slave, 0, 0, 0xf000000); /* Too many entries for master buffer */
                  stop = TRUE;
               }
               /* trim to maximum number of ODlist entries defined */
               if ((pODlist->Entries + n) > EC_MAXODLIST)
               {
                  n = EC_MAXODLIST - pODlist->Entries;
               }
               pODlist->Entries += n;
               /* extract indexes one by one */
               for (i = 0; i < n; i++)
               {
                  pODlist->Index[sp + i] = etohs(aSDOp->wdata[i + offset]);
               }
               sp += n;
               /* check if more fragments will follow */
               if (aSDOp->Fragments > 0)
               {   
                  stop = FALSE;
               }
               First = FALSE; 
               offset = 0;
            }
            /* got unexpected response from slave */
            else
            {
               if ((aSDOp->Opcode &  0x7f) == ECT_SDOINFO_ERROR) /* SDO info error received */
               {
                  ecx_SDOinfoerror(context, Slave, 0, 0, etohl(aSDOp->ldata[0]));
                  stop = TRUE;
               }
               else
               {
                  ecx_packeterror(context, Slave, 0, 0, 1); /* Unexpected frame returned */
               }
               wkc = 0; 
               x += 20;
            }
         }
         x++;
      }
      while ((x <= 128) && !stop);
   }
   return wkc;
}